

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::DefaultsTest::CheckIndexed64
          (DefaultsTest *this,GLenum pname,GLuint index,GLint64 expected)

{
  ostringstream *this_00;
  long lVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  GLint64 result;
  long local_1c8;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1c8 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xb78))(this->m_vao,index,pname,&local_1c8);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glGetVertexArrayIndexed64iv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0xfff);
  lVar1 = local_1c8;
  if (local_1c8 != expected) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Default Vertex Array Object at index ",0x25);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," has parameter ",0xf);
    local_1c0.m_getName = glu::getVertexAttribParameterNameName;
    local_1c0.m_value = pname;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," equal to ",10);
    std::ostream::_M_insert<long>((long)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", but ",6);
    std::ostream::_M_insert<long>((long)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," was expected. Test fails.",0x1a);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return lVar1 == expected;
}

Assistant:

bool DefaultsTest::CheckIndexed64(const glw::GLenum pname, const glw::GLuint index, const glw::GLint64 expected)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint64 result = 0;

	gl.getVertexArrayIndexed64iv(m_vao, index, pname, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetVertexArrayIndexed64iv call failed.");

	if (result != expected)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Default Vertex Array Object at index " << index
											<< " has parameter " << glu::getVertexAttribParameterNameStr(pname)
											<< " equal to " << result << ", but " << expected
											<< " was expected. Test fails." << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}